

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusreply.h
# Opt level: O1

QDBusReply<QVariant> * __thiscall
QDBusReply<QVariant>::operator=(QDBusReply<QVariant> *this,QDBusMessage *reply)

{
  bool bVar1;
  QMetaType QVar2;
  anon_union_24_3_e3d07ef4_for_data *paVar3;
  long in_FS_OFFSET;
  QDBusVariant t;
  anon_union_24_3_e3d07ef4_for_data local_88;
  undefined8 local_70;
  InterfaceType *local_68 [4];
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  paVar3 = &local_48;
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)paVar3,(QMetaType)0x801238,(void *)0x0);
  qDBusReplyFill(reply,&this->m_error,(QVariant *)paVar3);
  local_68[0] = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusVariant>::metaType;
  local_88.shared = (PrivateShared *)((ulong)puStack_30 & 0xfffffffffffffffc);
  bVar1 = comparesEqual((QMetaType *)&local_88.shared,(QMetaType *)local_68);
  if (bVar1) {
    if (((ulong)puStack_30 & 1) == 0) {
      paVar3 = &local_48;
    }
    else {
      paVar3 = (anon_union_24_3_e3d07ef4_for_data *)
               (local_48.shared + *(int *)(local_48.shared + 4));
    }
    ::QVariant::QVariant((QVariant *)&local_88,(QVariant *)paVar3);
  }
  else {
    local_88.shared = (PrivateShared *)0x0;
    local_88._8_8_ = 0;
    local_88._16_8_ = 0;
    local_70 = 2;
    QVar2.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if (((ulong)puStack_30 & 1) != 0) {
      paVar3 = (anon_union_24_3_e3d07ef4_for_data *)
               (local_48.shared + *(int *)(local_48.shared + 4));
    }
    QMetaType::convert(QVar2,paVar3,(QMetaType)local_68[0],&local_88);
  }
  ::QVariant::QVariant((QVariant *)local_68,(QVariant *)&local_88);
  ::QVariant::operator=(&this->m_data,(QVariant *)local_68);
  ::QVariant::~QVariant((QVariant *)local_68);
  ::QVariant::~QVariant((QVariant *)&local_88);
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDBusReply<QVariant>&
QDBusReply<QVariant>::operator=(const QDBusMessage &reply)
{
    QVariant data(QMetaType::fromType<QDBusVariant>());
    qDBusReplyFill(reply, m_error, data);
    m_data = qvariant_cast<QDBusVariant>(data).variant();
    return *this;
}